

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void UpdateWindowInFocusOrderList(ImGuiWindow *window,bool just_created,ImGuiWindowFlags new_flags)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow **ppIVar3;
  ImGuiContext *pIVar4;
  ImGuiWindow **ppIVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  ImGuiWindow **ppIVar10;
  int iVar11;
  ImGuiContext *ctx;
  
  pIVar4 = GImGui;
  uVar7 = new_flags & 0x1000000;
  bVar9 = SUB41(uVar7 >> 0x18,0);
  if ((~just_created & uVar7 >> 0x18 == (uint)window->IsExplicitChild) == 0 && bVar9 == false) {
    ppIVar5 = (GImGui->WindowsFocusOrder).Data;
    iVar2 = (GImGui->WindowsFocusOrder).Size;
    ppIVar3 = ppIVar5 + iVar2;
    do {
      ppIVar10 = ppIVar5;
      if (ppIVar3 <= ppIVar10) goto LAB_001619c6;
      ppIVar5 = ppIVar10 + 1;
    } while (*ppIVar10 != window);
    if (ppIVar10 < ppIVar3) {
      __assert_fail("!g.WindowsFocusOrder.contains(window)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x15ea,
                    "void UpdateWindowInFocusOrderList(ImGuiWindow *, bool, ImGuiWindowFlags)");
    }
LAB_001619c6:
    iVar8 = (GImGui->WindowsFocusOrder).Capacity;
    if (iVar2 == iVar8) {
      if (iVar8 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar8 / 2 + iVar8;
      }
      iVar11 = iVar2 + 1;
      if (iVar2 + 1 < iVar6) {
        iVar11 = iVar6;
      }
      if (iVar8 < iVar11) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        ppIVar5 = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar11 << 3,GImAllocatorUserData);
        ppIVar3 = (pIVar4->WindowsFocusOrder).Data;
        if (ppIVar3 != (ImGuiWindow **)0x0) {
          memcpy(ppIVar5,ppIVar3,(long)(pIVar4->WindowsFocusOrder).Size << 3);
          ppIVar3 = (pIVar4->WindowsFocusOrder).Data;
          if ((ppIVar3 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
        }
        (pIVar4->WindowsFocusOrder).Data = ppIVar5;
        (pIVar4->WindowsFocusOrder).Capacity = iVar11;
      }
    }
    (pIVar4->WindowsFocusOrder).Data[(pIVar4->WindowsFocusOrder).Size] = window;
    iVar2 = (pIVar4->WindowsFocusOrder).Size;
    (pIVar4->WindowsFocusOrder).Size = iVar2 + 1;
    window->FocusOrder = (short)iVar2;
  }
  else if ((uVar7 != 0 && !just_created) && uVar7 >> 0x18 != (uint)window->IsExplicitChild) {
    uVar7 = (uint)window->FocusOrder;
    if ((window->FocusOrder < 0) || (iVar2 = (GImGui->WindowsFocusOrder).Size, iVar2 <= (int)uVar7))
    {
LAB_00161ab0:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                    ,0x74f,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
    }
    ppIVar3 = (GImGui->WindowsFocusOrder).Data;
    if (ppIVar3[uVar7] != window) {
      __assert_fail("g.WindowsFocusOrder[window->FocusOrder] == window",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x15f0,
                    "void UpdateWindowInFocusOrderList(ImGuiWindow *, bool, ImGuiWindowFlags)");
    }
    iVar8 = uVar7 + 1;
    if (iVar8 < iVar2) {
      ppIVar5 = ppIVar3 + uVar7;
      do {
        ppIVar5 = ppIVar5 + 1;
        if ((pIVar4->WindowsFocusOrder).Size <= iVar8) goto LAB_00161ab0;
        (*ppIVar5)->FocusOrder = (*ppIVar5)->FocusOrder + -1;
        iVar8 = iVar8 + 1;
      } while (iVar8 < iVar2);
    }
    ppIVar5 = (pIVar4->WindowsFocusOrder).Data + window->FocusOrder;
    if ((ppIVar5 < ppIVar3) || (ppIVar3 + iVar2 <= ppIVar5)) {
      __assert_fail("it >= Data && it < Data + Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                    ,0x766,"T *ImVector<ImGuiWindow *>::erase(const T *) [T = ImGuiWindow *]");
    }
    memmove(ppIVar5,ppIVar5 + 1,(((ulong)~((long)ppIVar5 - (long)ppIVar3) >> 3) + (long)iVar2) * 8);
    (pIVar4->WindowsFocusOrder).Size = (pIVar4->WindowsFocusOrder).Size + -1;
    window->FocusOrder = -1;
  }
  window->IsExplicitChild = bVar9;
  return;
}

Assistant:

static void UpdateWindowInFocusOrderList(ImGuiWindow* window, bool just_created, ImGuiWindowFlags new_flags)
{
    ImGuiContext& g = *GImGui;

    const bool new_is_explicit_child = (new_flags & ImGuiWindowFlags_ChildWindow) != 0;
    const bool child_flag_changed = new_is_explicit_child != window->IsExplicitChild;
    if ((just_created || child_flag_changed) && !new_is_explicit_child)
    {
        IM_ASSERT(!g.WindowsFocusOrder.contains(window));
        g.WindowsFocusOrder.push_back(window);
        window->FocusOrder = (short)(g.WindowsFocusOrder.Size - 1);
    }
    else if (!just_created && child_flag_changed && new_is_explicit_child)
    {
        IM_ASSERT(g.WindowsFocusOrder[window->FocusOrder] == window);
        for (int n = window->FocusOrder + 1; n < g.WindowsFocusOrder.Size; n++)
            g.WindowsFocusOrder[n]->FocusOrder--;
        g.WindowsFocusOrder.erase(g.WindowsFocusOrder.Data + window->FocusOrder);
        window->FocusOrder = -1;
    }
    window->IsExplicitChild = new_is_explicit_child;
}